

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

BasicBlock * create_block(Proc *proc)

{
  C_MemoryAllocator *pCVar1;
  uint uVar2;
  BasicBlock **__dest;
  BasicBlock *pBVar3;
  uint uVar4;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  uVar2 = proc->node_count;
  uVar4 = proc->allocated;
  if (uVar4 <= uVar2) {
    uVar4 = uVar4 + 0x19;
    __dest = (BasicBlock **)(*pCVar1->calloc)(pCVar1->arena,(size_t)uVar4,8);
    if (__dest == (BasicBlock **)0x0) {
      __assert_fail("new_data != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0xb74,"BasicBlock *create_block(Proc *)");
    }
    if (proc->node_count == 0) {
      uVar2 = 0;
    }
    else {
      memcpy(__dest,proc->nodes,(ulong)proc->allocated << 3);
      uVar2 = proc->node_count;
    }
    proc->allocated = uVar4;
    proc->nodes = __dest;
  }
  if (uVar2 < uVar4) {
    pBVar3 = (BasicBlock *)(*pCVar1->calloc)(pCVar1->arena,1,0x10);
    uVar2 = proc->node_count;
    pBVar3->index = uVar2;
    proc->node_count = uVar2 + 1;
    proc->nodes[uVar2] = pBVar3;
    return pBVar3;
  }
  __assert_fail("proc->node_count < proc->allocated",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0xb7b,"BasicBlock *create_block(Proc *)");
}

Assistant:

static BasicBlock *create_block(Proc *proc)
{
	C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
	if (proc->node_count >= proc->allocated) {
		unsigned new_size = proc->allocated + 25;
		BasicBlock **new_data = (BasicBlock **)
		    allocator->calloc(allocator->arena, new_size, sizeof(BasicBlock *));
		assert(new_data != NULL);
		if (proc->node_count > 0) {
			memcpy(new_data, proc->nodes, proc->allocated * sizeof(BasicBlock *));
		}
		proc->allocated = new_size;
		proc->nodes = new_data;
	}
	assert(proc->node_count < proc->allocated);
	BasicBlock *new_block = (BasicBlock *) allocator->calloc(allocator->arena, 1, sizeof(BasicBlock));
	/* note that each block must have an index that can be used to access the block as nodes[index] */
	new_block->index = proc->node_count;
	proc->nodes[proc->node_count++] = new_block;
	return new_block;
}